

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv6Transmitter::ClearDestinations(RTPUDPv6Transmitter *this)

{
  RTPUDPv6Transmitter *this_local;
  
  if (((this->init & 1U) != 0) && ((this->created & 1U) != 0)) {
    RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
    ::Clear(&this->destinations);
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::ClearDestinations()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
		destinations.Clear();
	MAINMUTEX_UNLOCK
}